

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::HttpHeaders::Response> * __thiscall
kj::HttpHeaders::tryParseResponse
          (Maybe<kj::HttpHeaders::Response> *__return_storage_ptr__,HttpHeaders *this,
          ArrayPtr<char> content)

{
  bool bVar1;
  char *end;
  char *pcVar2;
  long lVar3;
  uint uVar4;
  StringPtr SVar5;
  ArrayPtr<char> content_00;
  char *ptr;
  NullableValue<kj::StringPtr> version;
  kj *local_70;
  char *local_68;
  char *local_60;
  anon_union_16_1_a8c68091_for_NullableValue<kj::StringPtr>_2 local_58;
  char local_48;
  StringPtr local_40;
  
  content_00.size_ = (kj *)content.ptr;
  content_00.ptr = (char *)content.size_;
  end = trimHeaderEnding(content_00.size_,content_00);
  if (end != (char *)0x0) {
    local_70 = content_00.size_;
    consumeWord((Maybe<kj::StringPtr> *)&local_60,(char **)&local_70);
    local_48 = local_60._0_1_;
    if (local_60._0_1_ == true) {
      local_40.content.ptr = local_58.value.content.ptr;
      local_40.content.size_ = local_58.value.content.size_;
      local_60 = "HTTP/";
      local_58.value.content.ptr = (char *)0x6;
      bVar1 = StringPtr::startsWith(&local_40,(StringPtr *)&local_60);
      if (bVar1) {
        pcVar2 = skipSpace((char *)local_70);
        uVar4 = 0;
        for (lVar3 = 0; (byte)(pcVar2[lVar3] - 0x30U) < 10; lVar3 = lVar3 + 1) {
          uVar4 = (uVar4 * 10 + (uint)(byte)pcVar2[lVar3]) - 0x30;
        }
        if (lVar3 != 0) {
          local_70 = (kj *)(pcVar2 + lVar3);
          SVar5 = consumeLine((char **)&local_70);
          local_68 = SVar5.content.ptr;
          bVar1 = parseHeaders(this,(char *)local_70,end);
          if (bVar1) {
            (__return_storage_ptr__->ptr).isSet = true;
            (__return_storage_ptr__->ptr).field_1.value.statusCode = uVar4;
            (__return_storage_ptr__->ptr).field_1.value.statusText.content.ptr = local_68;
            (__return_storage_ptr__->ptr).field_1.value.statusText.content.size_ =
                 SVar5.content.size_;
            return __return_storage_ptr__;
          }
        }
      }
    }
  }
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<HttpHeaders::Response> HttpHeaders::tryParseResponse(kj::ArrayPtr<char> content) {
  char* end = trimHeaderEnding(content);
  if (end == nullptr) return nullptr;

  char* ptr = content.begin();

  HttpHeaders::Response response;

  KJ_IF_MAYBE(version, consumeWord(ptr)) {
    if (!version->startsWith("HTTP/")) return nullptr;
  } else {
    return nullptr;
  }

  KJ_IF_MAYBE(code, consumeNumber(ptr)) {
    response.statusCode = *code;
  } else {
    return nullptr;
  }

  response.statusText = consumeLine(ptr);

  if (!parseHeaders(ptr, end)) return nullptr;

  return response;
}